

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall
efsw::String::substr(String *__return_storage_ptr__,String *this,size_t pos,size_t n)

{
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_48;
  size_t local_28;
  size_t n_local;
  size_t pos_local;
  String *this_local;
  
  local_28 = n;
  n_local = pos;
  pos_local = (size_t)this;
  this_local = __return_storage_ptr__;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  substr(&local_48,&this->mString,pos,n);
  String(__return_storage_ptr__,&local_48);
  std::__cxx11::u32string::~u32string((u32string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

String String::substr( std::size_t pos, std::size_t n ) const {
	return String( mString.substr( pos, n ) );
}